

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

double Highs_getHighsInfinity(void *highs)

{
  double dVar1;
  string *alt_method_name;
  string *in_stack_ffffffffffffff98;
  Highs *in_stack_ffffffffffffffa0;
  undefined1 local_29 [41];
  
  alt_method_name = (string *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_29 + 1),"Highs_getHighsInfinity",(allocator *)alt_method_name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffa0,"Highs_getInfinity",
             (allocator *)&stack0xffffffffffffff9f);
  Highs::deprecationMessage(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,alt_method_name);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  dVar1 = Highs_getInfinity((void *)0x43e135);
  return dVar1;
}

Assistant:

double Highs_getHighsInfinity(const void* highs) {
  ((Highs*)highs)
      ->deprecationMessage("Highs_getHighsInfinity", "Highs_getInfinity");
  return Highs_getInfinity(highs);
}